

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iraffits.c
# Opt level: O3

int hgeti4(char *hstring,char *keyword,int *ival)

{
  char *__s;
  char *pcVar1;
  double dVar2;
  char val [30];
  char acStack_38 [32];
  
  __s = hgetc(hstring,keyword);
  pcVar1 = __s;
  if (__s != (char *)0x0) {
    pcVar1 = (char *)strlen(__s);
    if (pcVar1 < (char *)0x1e) {
      strcpy(acStack_38,__s);
      dVar2 = atof(acStack_38);
      pcVar1 = (char *)0x7fffffff;
      if (dVar2 + 0.001 <= 2147483647.0) {
        if (0.0 <= dVar2) {
          pcVar1 = (char *)(ulong)(uint)(int)(dVar2 + 0.001);
        }
        else {
          pcVar1 = (char *)0x80000000;
          if (-2147483648.0 <= dVar2 + -0.001) {
            pcVar1 = (char *)(ulong)(uint)(int)(dVar2 + -0.001);
          }
        }
      }
      *ival = (int)pcVar1;
    }
  }
  return (int)pcVar1;
}

Assistant:

static int
hgeti4 (hstring,keyword,ival)

char *hstring;	/* character string containing FITS header information
		   in the format <keyword>= <value> {/ <comment>} */
char *keyword;	/* character string containing the name of the keyword
		   the value of which is returned.  hget searches for a
		   line beginning with this string.  if "[n]" is present,
		   the n'th token in the value is returned.
		   (the first 8 characters must be unique) */
int *ival;
{
char *value;
double dval;
int minint;
char val[30]; 

/* Get value and comment from header string */
	value = hgetc (hstring,keyword);

/* Translate value from ASCII to binary */
	if (value != NULL) {
	    minint = -MAXINT - 1;
            if (strlen(value) > 29)
               return(0);
	    strcpy (val, value);
	    dval = atof (val);
	    if (dval+0.001 > MAXINT)
		*ival = MAXINT;
	    else if (dval >= 0)
		*ival = (int) (dval + 0.001);
	    else if (dval-0.001 < minint)
		*ival = minint;
	    else
		*ival = (int) (dval - 0.001);
	    return (1);
	    }
	else {
	    return (0);
	    }
}